

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::commitParameters(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  MMAL_FOURCC_T MVar2;
  ostream *poVar3;
  Private_Impl_Still *in_RDI;
  MMAL_PARAMETER_INPUT_CROP_T crop;
  MMAL_PARAMETER_COLOURFX_T colfx;
  uint32_t local_34;
  uint32_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  MMAL_PARAMETER_HEADER_T local_1c;
  undefined8 local_14;
  undefined4 local_c;
  
  if ((in_RDI->changedSettings & 1U) != 0) {
    commitSharpness(in_RDI);
    commitContrast(in_RDI);
    commitBrightness(in_RDI);
    commitQuality(in_RDI);
    commitSaturation(in_RDI);
    commitISO(in_RDI);
    commitExposure((Private_Impl_Still *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    commitMetering((Private_Impl_Still *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    commitAWB((Private_Impl_Still *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    commitImageEffect((Private_Impl_Still *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    commitRotation(in_RDI);
    commitFlips((Private_Impl_Still *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
    ;
    MVar1 = mmal_port_parameter_set_boolean(in_RDI->camera->control,0x1001d,0);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar3,": Failed to set video stabilization parameter.\n");
    }
    MVar1 = mmal_port_parameter_set_int32(in_RDI->camera->control,0x1000d,0);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar3,": Failed to set exposure compensation parameter.\n");
    }
    local_1c.id = 0x10007;
    local_1c.size = 0x14;
    local_14 = 0x8000000000;
    local_c = 0x80;
    MVar1 = mmal_port_parameter_set(in_RDI->camera->control,&local_1c);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar3,": Failed to set color effects parameter.\n");
    }
    local_34 = 0x10025;
    MVar1 = mmal_port_parameter_set(in_RDI->camera->control,(MMAL_PARAMETER_HEADER_T *)&local_34);
    if (MVar1 != MMAL_SUCCESS) {
      poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar3,": Failed to set ROI parameter.\n");
    }
    if (in_RDI->encoder_output_port != (MMAL_PORT_T *)0x0) {
      MVar2 = convertEncoding(in_RDI,in_RDI->encoding);
      in_RDI->encoder_output_port->format->encoding = MVar2;
      mmal_port_format_commit(in_RDI->encoder_output_port);
    }
    in_RDI->changedSettings = false;
  }
  return;
}

Assistant:

void Private_Impl_Still::commitParameters() {
            if ( !changedSettings ) return;
            commitSharpness();
            commitContrast();
            commitBrightness();
            commitQuality();
            commitSaturation();
            commitISO();
            commitExposure();
            commitMetering();
            commitAWB();
            commitImageEffect();
            commitRotation();
            commitFlips();
            // Set Video Stabilization
            if ( mmal_port_parameter_set_boolean ( camera->control, MMAL_PARAMETER_VIDEO_STABILISATION, 0 ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set video stabilization parameter.\n";
            // Set Exposure Compensation
            if ( mmal_port_parameter_set_int32 ( camera->control, MMAL_PARAMETER_EXPOSURE_COMP , 0 ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set exposure compensation parameter.\n";
            // Set Color Efects
            MMAL_PARAMETER_COLOURFX_T colfx = {{MMAL_PARAMETER_COLOUR_EFFECT,sizeof ( colfx ) }, 0, 0, 0};
            colfx.enable = 0;
            colfx.u = 128;
            colfx.v = 128;
            if ( mmal_port_parameter_set ( camera->control, &colfx.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set color effects parameter.\n";
            // Set ROI
            MMAL_PARAMETER_INPUT_CROP_T crop = {{MMAL_PARAMETER_INPUT_CROP, sizeof ( MMAL_PARAMETER_INPUT_CROP_T ) }};
            crop.rect.x = ( 65536 * 0 );
            crop.rect.y = ( 65536 * 0 );
            crop.rect.width = ( 65536 * 1 );
            crop.rect.height = ( 65536 * 1 );
            if ( mmal_port_parameter_set ( camera->control, &crop.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set ROI parameter.\n";
            // Set encoder encoding
            if ( encoder_output_port != NULL ) {
                encoder_output_port->format->encoding = convertEncoding ( encoding );
                mmal_port_format_commit ( encoder_output_port );
            }
            changedSettings = false;
        }